

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O1

void Ssw_SmlSimulateOne(Ssw_Sml_t *p)

{
  Aig_Obj_t *pObj;
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Aig_Man_t *pAVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  timespec ts;
  timespec local_38;
  
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  if (0 < p->nFrames) {
    iVar1 = 0;
    do {
      pVVar2 = p->pAig->vObjs;
      if (0 < pVVar2->nSize) {
        lVar8 = 0;
        do {
          pObj = (Aig_Obj_t *)pVVar2->pArray[lVar8];
          if ((pObj != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7)) {
            Ssw_SmlNodeSimulate(p,pObj,iVar1);
          }
          lVar8 = lVar8 + 1;
          pVVar2 = p->pAig->vObjs;
        } while (lVar8 < pVVar2->nSize);
      }
      pAVar3 = p->pAig;
      if (0 < pAVar3->nTruePos) {
        lVar8 = 0;
        do {
          if (pAVar3->vCos->nSize <= lVar8) goto LAB_0061ea1b;
          Ssw_SmlNodeCopyFanin(p,(Aig_Obj_t *)pAVar3->vCos->pArray[lVar8],iVar1);
          lVar8 = lVar8 + 1;
          pAVar3 = p->pAig;
        } while (lVar8 < pAVar3->nTruePos);
      }
      pAVar3 = p->pAig;
      if (0 < pAVar3->nRegs) {
        iVar6 = 0;
        do {
          uVar4 = pAVar3->nTruePos + iVar6;
          if (((int)uVar4 < 0) || (pAVar3->vCos->nSize <= (int)uVar4)) goto LAB_0061ea1b;
          Ssw_SmlNodeCopyFanin(p,(Aig_Obj_t *)pAVar3->vCos->pArray[uVar4],iVar1);
          iVar6 = iVar6 + 1;
          pAVar3 = p->pAig;
        } while (iVar6 < pAVar3->nRegs);
      }
      if (iVar1 == p->nFrames + -1) break;
      pAVar3 = p->pAig;
      if (0 < pAVar3->nRegs) {
        iVar6 = 0;
        do {
          uVar4 = pAVar3->nTruePos + iVar6;
          if (((((int)uVar4 < 0) || (pAVar3->vCos->nSize <= (int)uVar4)) ||
              (uVar7 = pAVar3->nTruePis + iVar6, (int)uVar7 < 0)) ||
             (pAVar3->vCis->nSize <= (int)uVar7)) {
LAB_0061ea1b:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          Ssw_SmlNodeTransferNext
                    (p,(Aig_Obj_t *)pAVar3->vCos->pArray[uVar4],
                     (Aig_Obj_t *)pAVar3->vCis->pArray[uVar7],iVar1);
          iVar6 = iVar6 + 1;
          pAVar3 = p->pAig;
        } while (iVar6 < pAVar3->nRegs);
      }
      iVar1 = iVar1 + 1;
    } while (iVar1 < p->nFrames);
  }
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  p->timeSim = p->timeSim + lVar8 + lVar5;
  p->nSimRounds = p->nSimRounds + 1;
  return;
}

Assistant:

void Ssw_SmlSimulateOne( Ssw_Sml_t * p )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int f, i;
    abctime clk;
clk = Abc_Clock();
    for ( f = 0; f < p->nFrames; f++ )
    {
        // simulate the nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
            Ssw_SmlNodeSimulate( p, pObj, f );
        // copy simulation info into outputs
        Saig_ManForEachPo( p->pAig, pObj, i )
            Ssw_SmlNodeCopyFanin( p, pObj, f );
        // copy simulation info into outputs
        Saig_ManForEachLi( p->pAig, pObj, i )
            Ssw_SmlNodeCopyFanin( p, pObj, f );
        // quit if this is the last timeframe
        if ( f == p->nFrames - 1 )
            break;
        // copy simulation info into the inputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
            Ssw_SmlNodeTransferNext( p, pObjLi, pObjLo, f );
    }
p->timeSim += Abc_Clock() - clk;
p->nSimRounds++;
}